

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O0

bool __thiscall draco::ObjDecoder::ParseFace(ObjDecoder *this,Status *status)

{
  PointIndex point_index;
  bool bVar1;
  DecoderBuffer *pDVar2;
  ObjDecoder *in_RDI;
  bool is_end;
  int num_indices;
  AttributeValueIndex avi;
  int triangulated_index;
  PointIndex vert_id;
  int c_1;
  int t;
  int nt;
  int i;
  int num_valid_indices;
  array<int,_3UL> indices [8];
  char c;
  int kMaxCorners;
  PointAttribute *in_stack_fffffffffffffe78;
  Status *msg;
  AttributeValueIndex in_stack_fffffffffffffe80;
  undefined2 in_stack_fffffffffffffe84;
  byte in_stack_fffffffffffffe86;
  undefined1 in_stack_fffffffffffffe87;
  undefined1 uVar3;
  DecoderBuffer *in_stack_fffffffffffffe88;
  allocator<char> local_161;
  array<int,_3UL> *in_stack_fffffffffffffea0;
  ObjDecoder *in_stack_fffffffffffffea8;
  allocator<char> *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  int local_114;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_108;
  uint local_104;
  int local_100;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  allocator<char> local_d9;
  string local_d8 [8];
  array<int,_3UL> *in_stack_ffffffffffffff30;
  ObjDecoder *in_stack_ffffffffffffff38;
  PointIndex in_stack_ffffffffffffff44;
  int local_90;
  int local_8c;
  char local_1d [28];
  bool local_1;
  
  local_1d[1] = '\b';
  local_1d[2] = '\0';
  local_1d[3] = '\0';
  local_1d[4] = '\0';
  pDVar2 = buffer(in_RDI);
  bVar1 = DecoderBuffer::Peek<char>(pDVar2,local_1d);
  if (bVar1) {
    if (local_1d[0] == 'f') {
      pDVar2 = buffer(in_RDI);
      DecoderBuffer::Advance(pDVar2,1);
      if ((in_RDI->counting_mode_ & 1U) == 0) {
        local_8c = 0;
        for (local_90 = 0; local_90 < 8; local_90 = local_90 + 1) {
          bVar1 = ParseVertexIndices(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
          if (!bVar1) {
            if (local_90 < 3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
                         in_stack_fffffffffffffeb0);
              Status::Status((Status *)
                             CONCAT17(in_stack_fffffffffffffe87,
                                      CONCAT16(in_stack_fffffffffffffe86,
                                               CONCAT24(in_stack_fffffffffffffe84,
                                                        in_stack_fffffffffffffe80.value_))),
                             (Code)((ulong)in_stack_fffffffffffffe78 >> 0x20),(string *)0x117047);
              Status::operator=((Status *)
                                CONCAT17(in_stack_fffffffffffffe87,
                                         CONCAT16(in_stack_fffffffffffffe86,
                                                  CONCAT24(in_stack_fffffffffffffe84,
                                                           in_stack_fffffffffffffe80.value_))),
                                (Status *)in_stack_fffffffffffffe78);
              Status::~Status((Status *)0x11706d);
              std::__cxx11::string::~string(local_d8);
              std::allocator<char>::~allocator(&local_d9);
              return true;
            }
            break;
          }
          local_8c = local_8c + 1;
        }
        local_f0 = local_8c + -2;
        for (local_f4 = 0; local_f4 < local_f0; local_f4 = local_f4 + 1) {
          for (local_f8 = 0; local_f8 < 3; local_f8 = local_f8 + 1) {
            IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType
                      (&local_fc,in_RDI->num_obj_faces_ * 3 + local_f8);
            local_100 = Triangulate(local_f4,local_f8);
            local_104 = local_fc.value_;
            MapPointToVertexIndices
                      (in_stack_ffffffffffffff38,in_stack_ffffffffffffff44,in_stack_ffffffffffffff30
                      );
            if (-1 < in_RDI->added_edge_att_id_) {
              bVar1 = IsNewEdge(local_f0,local_f4,local_f8);
              IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType
                        (&local_108,(uint)bVar1);
              PointCloud::attribute
                        ((PointCloud *)
                         CONCAT17(in_stack_fffffffffffffe87,
                                  CONCAT16(in_stack_fffffffffffffe86,
                                           CONCAT24(in_stack_fffffffffffffe84,
                                                    in_stack_fffffffffffffe80.value_))),
                         (int32_t)((ulong)in_stack_fffffffffffffe78 >> 0x20));
              point_index.value_._2_1_ = in_stack_fffffffffffffe86;
              point_index.value_._0_2_ = in_stack_fffffffffffffe84;
              point_index.value_._3_1_ = in_stack_fffffffffffffe87;
              PointAttribute::SetPointMapEntry
                        (in_stack_fffffffffffffe78,point_index,in_stack_fffffffffffffe80);
            }
          }
          in_RDI->num_obj_faces_ = in_RDI->num_obj_faces_ + 1;
        }
      }
      else {
        buffer(in_RDI);
        parser::SkipWhitespace
                  ((DecoderBuffer *)
                   CONCAT17(in_stack_fffffffffffffe87,
                            CONCAT16(in_stack_fffffffffffffe86,
                                     CONCAT24(in_stack_fffffffffffffe84,
                                              in_stack_fffffffffffffe80.value_))));
        local_114 = 0;
        while( true ) {
          pDVar2 = buffer(in_RDI);
          bVar1 = DecoderBuffer::Peek<char>(pDVar2,local_1d);
          uVar3 = bVar1 && local_1d[0] != '\n';
          if (!bVar1 || local_1d[0] == '\n') break;
          buffer(in_RDI);
          bVar1 = parser::PeekWhitespace
                            (in_stack_fffffffffffffe88,
                             (bool *)CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffe86,
                                                             CONCAT24(in_stack_fffffffffffffe84,
                                                                      in_stack_fffffffffffffe80.
                                                                      value_))));
          if (bVar1) {
            pDVar2 = buffer(in_RDI);
            DecoderBuffer::Advance(pDVar2,1);
          }
          else {
            local_114 = local_114 + 1;
            while( true ) {
              buffer(in_RDI);
              bVar1 = parser::PeekWhitespace
                                (in_stack_fffffffffffffe88,
                                 (bool *)CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffe86,
                                                                 CONCAT24(in_stack_fffffffffffffe84,
                                                                          in_stack_fffffffffffffe80.
                                                                          value_))));
              in_stack_fffffffffffffe86 = 0;
              if (!bVar1) {
                in_stack_fffffffffffffe86 = 0xff;
              }
              if ((in_stack_fffffffffffffe86 & 1) == 0) break;
              pDVar2 = buffer(in_RDI);
              DecoderBuffer::Advance(pDVar2,1);
            }
          }
        }
        if (3 < local_114) {
          in_RDI->has_polygons_ = true;
        }
        if ((local_114 < 3) || (8 < local_114)) {
          msg = (Status *)&local_161;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
                     in_stack_fffffffffffffeb0);
          ErrorStatus((string *)msg);
          Status::operator=((Status *)
                            CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffe86,
                                                    CONCAT24(in_stack_fffffffffffffe84,
                                                             in_stack_fffffffffffffe80.value_))),msg
                           );
          Status::~Status((Status *)0x117408);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffea0);
          std::allocator<char>::~allocator(&local_161);
          return false;
        }
        in_RDI->num_obj_faces_ = local_114 + -2 + in_RDI->num_obj_faces_;
      }
      buffer(in_RDI);
      parser::SkipLine((DecoderBuffer *)0x1174ad);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ObjDecoder::ParseFace(Status *status) {
  constexpr int kMaxCorners = 8;
  char c;
  if (!buffer()->Peek(&c)) {
    return false;
  }
  if (c != 'f') {
    return false;
  }
  // Face definition found!
  buffer()->Advance(1);
  if (!counting_mode_) {
    std::array<int32_t, 3> indices[kMaxCorners];
    // Parse face indices.
    int num_valid_indices = 0;
    for (int i = 0; i < kMaxCorners; ++i) {
      if (!ParseVertexIndices(&indices[i])) {
        if (i >= 3) {
          break;  // It's OK if there is no fourth or higher vertex index.
        }
        *status = Status(Status::DRACO_ERROR, "Failed to parse vertex indices");
        return true;
      }
      ++num_valid_indices;
    }
    // Split quads and other n-gons into n - 2 triangles.
    const int nt = num_valid_indices - 2;
    // Iterate over triangles.
    for (int t = 0; t < nt; t++) {
      // Iterate over corners.
      for (int c = 0; c < 3; c++) {
        const PointIndex vert_id(3 * num_obj_faces_ + c);
        const int triangulated_index = Triangulate(t, c);
        MapPointToVertexIndices(vert_id, indices[triangulated_index]);
        // Save info about new edges that will allow us to reconstruct polygons.
        if (added_edge_att_id_ >= 0) {
          const AttributeValueIndex avi(IsNewEdge(nt, t, c));
          out_point_cloud_->attribute(added_edge_att_id_)
              ->SetPointMapEntry(vert_id, avi);
        }
      }
      ++num_obj_faces_;
    }
  } else {
    // We are in the counting mode.
    // We need to determine how many triangles are in the obj face.
    // Go over the line and check how many gaps there are between non-empty
    // sub-strings.
    parser::SkipWhitespace(buffer());
    int num_indices = 0;
    bool is_end = false;
    while (buffer()->Peek(&c) && c != '\n') {
      if (parser::PeekWhitespace(buffer(), &is_end)) {
        buffer()->Advance(1);
      } else {
        // Non-whitespace reached.. assume it's index declaration, skip it.
        num_indices++;
        while (!parser::PeekWhitespace(buffer(), &is_end) && !is_end) {
          buffer()->Advance(1);
        }
      }
    }
    if (num_indices > 3) {
      has_polygons_ = true;
    }
    if (num_indices < 3 || num_indices > kMaxCorners) {
      *status = ErrorStatus("Invalid number of indices on a face");
      return false;
    }
    // Either one or more new triangles.
    num_obj_faces_ += num_indices - 2;
  }
  parser::SkipLine(buffer());
  return true;
}